

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinChar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  UString *v;
  RuntimeError *pRVar1;
  allocator_type *in_RCX;
  char *pcVar2;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar3;
  stringstream ss;
  string local_1e8;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  v = (UString *)(local_1b0 + 0x10);
  local_1b0._0_8_ = v;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"char","");
  local_1e8._M_dataplus._M_p._0_4_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1e8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_1c8,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)local_1b0,args,&local_1c8);
  if (local_1c8.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((UString *)local_1b0._0_8_ != v) {
    operator_delete((void *)local_1b0._0_8_,
                    CONCAT44(local_1a0[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1a0[0]._M_allocated_capacity) + 1);
  }
  pcVar2 = (char *)(long)(((args->
                           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v).d;
  if (-1 < (long)pcVar2) {
    if (pcVar2 < 
        "aryOpEESt10_Select1stISB_ESt4lessIS5_ESaISB_EE22_M_emplace_hint_uniqueIJRKSt21piecewise_construct_tSt5tupleIJOS5_EESM_IJEEEEESt17_Rb_tree_iteratorISB_ESt23_Rb_tree_const_iteratorISB_EDpOT_"
       ) {
      local_1a0[0]._0_4_ = SUB84(pcVar2,0);
      local_1b0._8_8_ = 1;
      local_1a0[0]._M_allocated_capacity._4_4_ = 0;
      local_1b0._0_8_ = v;
      VVar3 = makeString(this,v);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar3._0_8_;
      if ((UString *)local_1b0._0_8_ != v) {
        operator_delete((void *)local_1b0._0_8_,
                        CONCAT44(local_1a0[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_1a0[0]._M_allocated_capacity) * 4 + 4);
      }
      return (AST *)0x0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"invalid unicode codepoint, got ",0x1f);
    std::ostream::_M_insert<long>((long)(local_1b0 + 0x10));
    pRVar1 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar1,&this->stack,loc,&local_1e8);
    __cxa_throw(pRVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 0x10),"codepoints must be >= 0, got ",0x1d);
  std::ostream::_M_insert<long>((long)(local_1b0 + 0x10));
  pRVar1 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar1,&this->stack,loc,&local_1e8);
  __cxa_throw(pRVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinChar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "char", args, {Value::NUMBER});
        long l = long(args[0].v.d);
        if (l < 0) {
            std::stringstream ss;
            ss << "codepoints must be >= 0, got " << l;
            throw makeError(loc, ss.str());
        }
        if (l >= JSONNET_CODEPOINT_MAX) {
            std::stringstream ss;
            ss << "invalid unicode codepoint, got " << l;
            throw makeError(loc, ss.str());
        }
        char32_t c = l;
        scratch = makeString(UString(&c, 1));
        return nullptr;
    }